

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_nl2br(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *pcVar1;
  bool bVar2;
  int local_48;
  int local_44;
  int nLen;
  int is_xhtml;
  char *zEnd;
  char *zCur;
  char *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_44 = 0;
  zIn = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    zCur = jx9_value_to_string(*apArg,&local_48);
    if (local_48 < 1) {
      jx9_result_null(pjStack_18);
    }
    else {
      if (1 < apArg_local._4_4_) {
        local_44 = jx9_value_to_bool(*(jx9_value **)(zIn + 8));
      }
      _nLen = zCur + local_48;
      while( true ) {
        pcVar1 = zCur;
        zEnd = zCur;
        while( true ) {
          bVar2 = false;
          if ((zCur < _nLen) && (bVar2 = false, *zCur != '\n')) {
            bVar2 = *zCur != '\r';
          }
          if (!bVar2) break;
          zCur = zCur + 1;
        }
        if (pcVar1 < zCur) {
          jx9_result_string(pjStack_18,pcVar1,(int)zCur - (int)pcVar1);
        }
        if (_nLen <= zCur) break;
        if (local_44 == 0) {
          jx9_result_string(pjStack_18,"<br/>",5);
        }
        else {
          jx9_result_string(pjStack_18,"<br>",4);
        }
        pcVar1 = zCur;
        zEnd = zCur;
        while( true ) {
          bVar2 = false;
          if ((zCur < _nLen) && (bVar2 = true, *zCur != '\n')) {
            bVar2 = *zCur == '\r';
          }
          if (!bVar2) break;
          zCur = zCur + 1;
        }
        if (pcVar1 < zCur) {
          jx9_result_string(pjStack_18,pcVar1,(int)zCur - (int)pcVar1);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_nl2br(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zCur, *zEnd;
	int is_xhtml = 0;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg > 1 ){
		is_xhtml = jx9_value_to_bool(apArg[1]);
	}
	zEnd = &zIn[nLen];
	/* Perform the requested operation */
	for(;;){
		zCur = zIn;
		/* Delimit the string */
		while( zIn < zEnd && (zIn[0] != '\n'&& zIn[0] != '\r') ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Output chunk verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		/* Output the HTML line break */
		if( is_xhtml ){
			jx9_result_string(pCtx, "<br>", (int)sizeof("<br>")-1);
		}else{
			jx9_result_string(pCtx, "<br/>", (int)sizeof("<br/>")-1);
		}
		zCur = zIn;
		/* Append trailing line */
		while( zIn < zEnd && (zIn[0] == '\n'  || zIn[0] == '\r') ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Output chunk verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
	}
	return JX9_OK;
}